

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_dotset_boolean(JSON_Object *object,char *name,int boolean)

{
  JSON_Status JVar1;
  JSON_Value *pJVar2;
  undefined4 in_EDX;
  JSON_Value *value;
  char *in_stack_00000020;
  JSON_Object *in_stack_00000028;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  pJVar2 = json_value_init_boolean((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (pJVar2 == (JSON_Value *)0x0) {
    local_4 = -1;
  }
  else {
    JVar1 = json_object_dotset_value(in_stack_00000028,in_stack_00000020,(JSON_Value *)object);
    if (JVar1 == 0) {
      local_4 = 0;
    }
    else {
      json_value_free((JSON_Value *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_object_dotset_boolean(JSON_Object *object, const char *name, int boolean) {
    JSON_Value *value = json_value_init_boolean(boolean);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_object_dotset_value(object, name, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}